

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O1

CHole * __thiscall Refal2::CHole::operator=(CHole *this,CHole *hole)

{
  CNodeType *pCVar1;
  
  this->left = hole->left;
  this->right = hole->right;
  if (hole != this) {
    pCVar1 = (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.first;
    if (pCVar1 != (CNodeType *)0x0) {
      CNodeList<Refal2::CUnit>::Remove
                ((CNodeList<Refal2::CUnit> *)this,pCVar1,
                 (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.last);
    }
    (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
    pCVar1 = (hole->super_CUnitList).super_CNodeList<Refal2::CUnit>.first;
    (hole->super_CUnitList).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.first = pCVar1;
    pCVar1 = (hole->super_CUnitList).super_CNodeList<Refal2::CUnit>.last;
    (hole->super_CUnitList).super_CNodeList<Refal2::CUnit>.last =
         (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.last;
    (this->super_CUnitList).super_CNodeList<Refal2::CUnit>.last = pCVar1;
  }
  return this;
}

Assistant:

CHole& CHole::operator=( const CHole& hole )
{
	left = hole.left;
	right = hole.right;
	const_cast<CHole&>( hole ).Move( *this );
	return *this;
}